

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O0

ValueType OpenMesh::IO::get_property_type(string *_string1,string *_string2)

{
  bool bVar1;
  string *_string2_local;
  string *_string1_local;
  
  bVar1 = std::operator==(_string1,"float32");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"float32"), bVar1)) {
    return ValueTypeFLOAT32;
  }
  bVar1 = std::operator==(_string1,"float64");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"float64"), bVar1)) {
    return ValueTypeFLOAT64;
  }
  bVar1 = std::operator==(_string1,"float");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"float"), bVar1)) {
    return ValueTypeFLOAT;
  }
  bVar1 = std::operator==(_string1,"double");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"double"), bVar1)) {
    return ValueTypeDOUBLE;
  }
  bVar1 = std::operator==(_string1,"int8");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"int8"), bVar1)) {
    return ValueTypeINT8;
  }
  bVar1 = std::operator==(_string1,"uint8");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"uint8"), bVar1)) {
    return ValueTypeUINT8;
  }
  bVar1 = std::operator==(_string1,"char");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"char"), bVar1)) {
    return ValueTypeCHAR;
  }
  bVar1 = std::operator==(_string1,"uchar");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"uchar"), bVar1)) {
    return ValueTypeUCHAR;
  }
  bVar1 = std::operator==(_string1,"int32");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"int32"), bVar1)) {
    return ValueTypeINT32;
  }
  bVar1 = std::operator==(_string1,"uint32");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"uint32"), bVar1)) {
    return ValueTypeUINT32;
  }
  bVar1 = std::operator==(_string1,"int");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"int"), bVar1)) {
    return ValueTypeINT;
  }
  bVar1 = std::operator==(_string1,"uint");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"uint"), bVar1)) {
    return ValueTypeUINT;
  }
  bVar1 = std::operator==(_string1,"int16");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"int16"), bVar1)) {
    return ValueTypeINT16;
  }
  bVar1 = std::operator==(_string1,"uint16");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"uint16"), bVar1)) {
    return ValueTypeUINT16;
  }
  bVar1 = std::operator==(_string1,"short");
  if ((bVar1) || (bVar1 = std::operator==(_string2,"short"), bVar1)) {
    return ValueTypeSHORT;
  }
  bVar1 = std::operator==(_string1,"ushort");
  if ((!bVar1) && (bVar1 = std::operator==(_string2,"ushort"), !bVar1)) {
    return Unsupported;
  }
  return ValueTypeUSHORT;
}

Assistant:

_PLYReader_::ValueType get_property_type(std::string _string1, std::string _string2) {

    if (_string1 == "float32" || _string2 == "float32")

        return _PLYReader_::ValueTypeFLOAT32;

    else if (_string1 == "float64" || _string2 == "float64")

        return _PLYReader_::ValueTypeFLOAT64;

    else if (_string1 == "float" || _string2 == "float")

        return _PLYReader_::ValueTypeFLOAT;

    else if (_string1 == "double" || _string2 == "double")

        return _PLYReader_::ValueTypeDOUBLE;

    else if (_string1 == "int8" || _string2 == "int8")

        return _PLYReader_::ValueTypeINT8;

    else if (_string1 == "uint8" || _string2 == "uint8")

        return _PLYReader_::ValueTypeUINT8;

    else if (_string1 == "char" || _string2 == "char")

        return _PLYReader_::ValueTypeCHAR;

    else if (_string1 == "uchar" || _string2 == "uchar")

        return _PLYReader_::ValueTypeUCHAR;

    else if (_string1 == "int32" || _string2 == "int32")

        return _PLYReader_::ValueTypeINT32;

    else if (_string1 == "uint32" || _string2 == "uint32")

        return _PLYReader_::ValueTypeUINT32;

    else if (_string1 == "int" || _string2 == "int")

        return _PLYReader_::ValueTypeINT;

    else if (_string1 == "uint" || _string2 == "uint")

        return _PLYReader_::ValueTypeUINT;

    else if (_string1 == "int16" || _string2 == "int16")

        return _PLYReader_::ValueTypeINT16;

    else if (_string1 == "uint16" || _string2 == "uint16")

        return _PLYReader_::ValueTypeUINT16;

    else if (_string1 == "short" || _string2 == "short")

        return _PLYReader_::ValueTypeSHORT;

    else if (_string1 == "ushort" || _string2 == "ushort")

        return _PLYReader_::ValueTypeUSHORT;

    return _PLYReader_::Unsupported;
}